

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

EC_T_BOOL CAtEmLogging::InitMsgBuffer
                    (MSG_BUFFER_DESC *pMsgBufferDesc,EC_T_DWORD dwMsgSize,EC_T_DWORD dwNumMsgs,
                    EC_T_BOOL bSkipDuplicates,EC_T_BOOL bPrintConsole,EC_T_BOOL bPrintTimestamp,
                    EC_T_CHAR *szMsgLogFileName,EC_T_CHAR *szMsgLogFileExt,EC_T_WORD wRollOver,
                    EC_T_CHAR *szBufferName)

{
  EC_T_CHAR *__dest;
  size_t __size;
  bool bVar1;
  LOG_MSG_DESC *__s;
  EC_T_CHAR *pEVar2;
  FILE *pFVar3;
  long lVar4;
  ulong __size_00;
  EC_T_BOOL EVar5;
  ulong uVar6;
  char local_138 [264];
  
  memset(local_138,0,0x100);
  pMsgBufferDesc->dwMsgSize = dwMsgSize;
  pMsgBufferDesc->dwNumMsgs = dwNumMsgs;
  pMsgBufferDesc->bPrintTimestamp = bPrintTimestamp;
  pMsgBufferDesc->bPrintConsole = bPrintConsole;
  pMsgBufferDesc->dwNextEmptyMsgIndex = 0;
  pMsgBufferDesc->dwNextPrintMsgIndex = 0;
  pMsgBufferDesc->wEntryCounter = 0;
  pMsgBufferDesc->pbyLogMemory = (EC_T_BYTE *)0x0;
  pMsgBufferDesc->pbyNextLogMsg = (EC_T_BYTE *)0x0;
  pMsgBufferDesc->dwLogMemorySize = 0;
  pMsgBufferDesc->bLogBufferFull = 0;
  pMsgBufferDesc->bSkipDuplicateMessages = bSkipDuplicates;
  pMsgBufferDesc->dwNumDuplicates = 0;
  pMsgBufferDesc->pszLastMsg = (EC_T_CHAR *)0x0;
  __size = (ulong)dwNumMsgs * 0x28;
  __s = (LOG_MSG_DESC *)malloc(__size);
  pMsgBufferDesc->paMsg = __s;
  if (__s != (LOG_MSG_DESC *)0x0) {
    memset(__s,0,__size);
    __size_00 = (ulong)((dwMsgSize + 1) * dwNumMsgs);
    pEVar2 = (EC_T_CHAR *)malloc(__size_00);
    if (pEVar2 != (EC_T_CHAR *)0x0) {
      __s->szMsgBuffer = pEVar2;
      uVar6 = 0;
      memset(pEVar2,0,__size_00);
      if (dwNumMsgs != 0) {
        lVar4 = 0;
        do {
          *(EC_T_CHAR **)((long)&__s->szMsgBuffer + lVar4) = pEVar2 + uVar6;
          *(undefined4 *)((long)&__s->bMsgCrLf + lVar4) = 1;
          lVar4 = lVar4 + 0x28;
          uVar6 = (ulong)((int)uVar6 + dwMsgSize + 1);
        } while ((ulong)dwNumMsgs * 0x28 != lVar4);
      }
      pMsgBufferDesc->wLogFileIndex = 0;
      pMsgBufferDesc->wEntryCounterLimit = wRollOver;
      pEVar2 = pMsgBufferDesc->szMsgLogFileName;
      strncpy(pEVar2,szMsgLogFileName,0xff);
      __dest = pMsgBufferDesc->szMsgLogFileExt;
      strncpy(__dest,szMsgLogFileExt,3);
      if (wRollOver == 0) {
        EcSnprintf(local_138,0xff,"%s.%s",pEVar2,__dest);
      }
      else {
        EcSnprintf(local_138,0xff,"%s.%x.%s",pEVar2,0,__dest);
      }
      if (bLogFileEnb == 0) {
        pMsgBufferDesc->pfMsgFile = (FILE *)0x0;
        pMsgBufferDesc->szMsgLogFileName[0] = '\0';
      }
      else {
        pFVar3 = fopen(local_138,"w+");
        pMsgBufferDesc->pfMsgFile = (FILE *)pFVar3;
        if (pFVar3 == (FILE *)0x0) {
          printf("ERROR: cannot create EtherCAT log file %s\n",local_138);
          LinuxSleep(3000);
        }
      }
      strncpy(pMsgBufferDesc->szLogName,szBufferName,0xff);
      pMsgBufferDesc->bIsInitialized = 1;
      EVar5 = 1;
      bVar1 = false;
      goto LAB_0014e40a;
    }
  }
  EVar5 = 0;
  printf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer \'%s\'\n",szBufferName);
  bVar1 = true;
LAB_0014e40a:
  if ((bVar1) && (pMsgBufferDesc->paMsg != (LOG_MSG_DESC *)0x0)) {
    free(pMsgBufferDesc->paMsg);
  }
  return EVar5;
}

Assistant:

EC_T_BOOL CAtEmLogging::InitMsgBuffer
(MSG_BUFFER_DESC*   pMsgBufferDesc      /* [in]  pointer to message buffer descriptor */
,EC_T_DWORD         dwMsgSize           /* [in]  size of a single message */
,EC_T_DWORD         dwNumMsgs           /* [in]  number of messages */
,EC_T_BOOL          bSkipDuplicates     /* [in]  EC_TRUE if duplicate messages shall be skipped */
,EC_T_BOOL          bPrintConsole       /* [in]  print message on console? */
,EC_T_BOOL          bPrintTimestamp     /* [in]  logging with time stamp? */
,EC_T_CHAR*         szMsgLogFileName    /* [in]  message log file name */
,EC_T_CHAR*         szMsgLogFileExt     /* [in]  message log file name */
,EC_T_WORD          wRollOver           /* [in]  roll over counter */
,EC_T_CHAR*         szBufferName        /* [in]  name of the logging buffer */
)
{
    EC_T_BOOL  bOk = EC_FALSE;
    EC_T_CHAR* pchMsgBuffer = EC_NULL;
    EC_T_DWORD dwBufSiz;
    EC_T_DWORD dwCnt;
#if (!(defined __RCX__) || (defined __MET__)) && !(defined RTAI)
    EC_T_CHAR  szfileNameTemp[MAX_PATH_LEN] = {0};
#endif

    pMsgBufferDesc->dwMsgSize = dwMsgSize;
    pMsgBufferDesc->dwNumMsgs = dwNumMsgs;
    pMsgBufferDesc->bPrintTimestamp = bPrintTimestamp;
    pMsgBufferDesc->bPrintConsole = bPrintConsole;
    pMsgBufferDesc->dwNextEmptyMsgIndex = 0;
    pMsgBufferDesc->dwNextPrintMsgIndex = 0;
    pMsgBufferDesc->wEntryCounter       = 0;
    pMsgBufferDesc->pbyLogMemory = EC_NULL;
    pMsgBufferDesc->dwLogMemorySize = 0;
    pMsgBufferDesc->pbyNextLogMsg = EC_NULL;
    pMsgBufferDesc->bLogBufferFull = EC_FALSE;
    pMsgBufferDesc->bSkipDuplicateMessages = bSkipDuplicates;
    pMsgBufferDesc->dwNumDuplicates = 0;
    pMsgBufferDesc->pszLastMsg = EC_NULL;

    pMsgBufferDesc->paMsg = (LOG_MSG_DESC*)OsMalloc(dwNumMsgs*sizeof(LOG_MSG_DESC));
    if (pMsgBufferDesc->paMsg == EC_NULL)
    {
        OsPrintf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer '%s'\n", szBufferName);
        goto Exit;
    }
    OsMemset(pMsgBufferDesc->paMsg, 0, dwNumMsgs*sizeof(LOG_MSG_DESC));

    dwBufSiz = dwNumMsgs * (dwMsgSize + 1);
    pchMsgBuffer = (EC_T_CHAR*)OsMalloc(dwBufSiz);
    if (pchMsgBuffer == EC_NULL)
    {
        OsPrintf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer '%s'\n", szBufferName);
        goto Exit;
    }

    /* Same as below. Needed to prevent false positive from static code analysis. */
    pMsgBufferDesc->paMsg[0].szMsgBuffer = pchMsgBuffer;

    OsMemset(pchMsgBuffer,0,dwBufSiz);
    for( dwCnt=0; dwCnt < dwNumMsgs; dwCnt++ )
    {
        pMsgBufferDesc->paMsg[dwCnt].szMsgBuffer = &pchMsgBuffer[dwCnt*(dwMsgSize+1)];
        pMsgBufferDesc->paMsg[dwCnt].bMsgCrLf = EC_TRUE;
    }

#if (defined __RCX__) || (defined __MET__) || (defined RTAI)
    pMsgBufferDesc->pfMsgFile = EC_NULL;
#else
    pMsgBufferDesc->wLogFileIndex    = 0;
    pMsgBufferDesc->wEntryCounterLimit = wRollOver;
    OsStrncpy(pMsgBufferDesc->szMsgLogFileName, szMsgLogFileName, sizeof(pMsgBufferDesc->szMsgLogFileName) - 1);
    OsStrncpy(pMsgBufferDesc->szMsgLogFileExt,  szMsgLogFileExt,  sizeof(pMsgBufferDesc->szMsgLogFileExt) - 1);

    if (0 != pMsgBufferDesc->wEntryCounterLimit )
    {
#ifdef FILESYS_8_3
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s_%x.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->wLogFileIndex, pMsgBufferDesc->szMsgLogFileExt);
#else
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s.%x.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->wLogFileIndex, pMsgBufferDesc->szMsgLogFileExt);
#endif
    }
    else
    {
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->szMsgLogFileExt);
    }

    if (bLogFileEnb)
    {
        pMsgBufferDesc->pfMsgFile = OsFopen( szfileNameTemp, "w+" );
        if (pMsgBufferDesc->pfMsgFile == EC_NULL )
        {
#if !(defined NOPRINTF)
            OsPrintf( "ERROR: cannot create EtherCAT log file %s\n", szfileNameTemp );
#endif
            OsSleep(3000);
        }
    }
    else
    {
        pMsgBufferDesc->pfMsgFile = EC_NULL;
        pMsgBufferDesc->szMsgLogFileName[0] = 0;
    }
    OsStrncpy(pMsgBufferDesc->szLogName, szBufferName, MAX_PATH_LEN - 1);

#endif
    pMsgBufferDesc->bIsInitialized = EC_TRUE;
    bOk = EC_TRUE;

Exit:
    if (!bOk)
    {
        if (pMsgBufferDesc->paMsg!=EC_NULL)
        {
            OsFree(pMsgBufferDesc->paMsg);
        }
        if (pchMsgBuffer == EC_NULL)
        {
            OsFree(pchMsgBuffer);
        }
    }
    return bOk;
}